

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# evaluate.c
# Opt level: O1

symbol * evaluate_alignof(dmr_C *C,expression *expr)

{
  symbol *psVar1;
  
  psVar1 = evaluate_type_information(C,expr);
  if (psVar1 == (symbol *)0x0) {
    psVar1 = (symbol *)0x0;
  }
  else {
    *(undefined1 *)expr = 1;
    (expr->field_5).field_0.value = (psVar1->field_14).field_2.ctype.alignment;
    (expr->field_5).field_0.taint = 0;
    psVar1 = C->target->size_t_ctype;
    expr->ctype = psVar1;
  }
  return psVar1;
}

Assistant:

static struct symbol *evaluate_alignof(struct dmr_C *C, struct expression *expr)
{
	struct symbol *type;

	type = evaluate_type_information(C, expr);
	if (!type)
		return NULL;

	expr->type = EXPR_VALUE;
	expr->value = type->ctype.alignment;
	expr->taint = 0;
	expr->ctype = C->target->size_t_ctype;
	return C->target->size_t_ctype;
}